

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ListNode * list_get_(List *list,uint index)

{
  ListNode *local_28;
  ListNode *curNode;
  int tmp;
  uint index_local;
  List *list_local;
  
  if (index < list->size) {
    curNode._0_4_ = 0;
    for (local_28 = list->head; local_28 != (ListNode *)0x0; local_28 = local_28->next) {
      if ((uint)curNode == index) {
        return local_28;
      }
      curNode._0_4_ = (uint)curNode + 1;
    }
  }
  return (ListNode *)0x0;
}

Assistant:

ListNode* list_get_(List * list, unsigned int index){
    if (index >= list->size || index < 0){
        return NULL;
    }
    int tmp = 0;
    ListNode *curNode = list->head;
    while (curNode != NULL){
        if (tmp == index){
            return curNode;
        }
        tmp++;
        curNode = curNode->next;
    }
    return NULL;
}